

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

bool cmPolicies::ApplyPolicyVersion(cmMakefile *mf,char *version)

{
  int iVar1;
  ostream *poVar2;
  uint minorVer;
  uint majorVer;
  uint patchVer;
  string defaultVar;
  uint tweakVer;
  vector<cmPolicies::PolicyID,_std::allocator<cmPolicies::PolicyID>_> ancientPolicies;
  string defaultValue;
  string ver;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&ver,"2.4.0",(allocator *)&e);
  if ((version != (char *)0x0) && (*version != '\0')) {
    std::__cxx11::string::assign((char *)&ver);
  }
  iVar1 = __isoc99_sscanf(ver._M_dataplus._M_p,"%u.%u.%u.%u");
  if (iVar1 < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,"Invalid policy version value \"");
    poVar2 = std::operator<<(poVar2,(string *)&ver);
    poVar2 = std::operator<<(poVar2,"\".  ");
    std::operator<<(poVar2,"A numeric major.minor[.patch[.tweak]] must be given.");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&defaultVar);
    std::__cxx11::string::~string((string *)&defaultVar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  else {
    std::__cxx11::string::string
              ((string *)&e,
               "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  For compatibility with older versions please use any CMake 2.8.x release or lower."
               ,(allocator *)&defaultVar);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  std::__cxx11::string::~string((string *)&ver);
  return false;
}

Assistant:

bool cmPolicies::ApplyPolicyVersion(cmMakefile* mf, const char* version)
{
  std::string ver = "2.4.0";

  if (version && strlen(version) > 0) {
    ver = version;
  }

  unsigned int majorVer = 2;
  unsigned int minorVer = 0;
  unsigned int patchVer = 0;
  unsigned int tweakVer = 0;

  // parse the string
  if (sscanf(ver.c_str(), "%u.%u.%u.%u", &majorVer, &minorVer, &patchVer,
             &tweakVer) < 2) {
    std::ostringstream e;
    e << "Invalid policy version value \"" << ver << "\".  "
      << "A numeric major.minor[.patch[.tweak]] must be given.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  // it is an error if the policy version is less than 2.4
  if (majorVer < 2 || (majorVer == 2 && minorVer < 4)) {
    mf->IssueMessage(
      cmake::FATAL_ERROR,
      "Compatibility with CMake < 2.4 is not supported by CMake >= 3.0.  "
      "For compatibility with older versions please use any CMake 2.8.x "
      "release or lower.");
    return false;
  }

  // It is an error if the policy version is greater than the running
  // CMake.
  if (majorVer > cmVersion::GetMajorVersion() ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer > cmVersion::GetMinorVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer > cmVersion::GetPatchVersion()) ||
      (majorVer == cmVersion::GetMajorVersion() &&
       minorVer == cmVersion::GetMinorVersion() &&
       patchVer == cmVersion::GetPatchVersion() &&
       tweakVer > cmVersion::GetTweakVersion())) {
    std::ostringstream e;
    e << "An attempt was made to set the policy version of CMake to \""
      << version << "\" which is greater than this version of CMake.  "
      << "This is not allowed because the greater version may have new "
      << "policies not known to this CMake.  "
      << "You may need a newer CMake version to build this project.";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  // now loop over all the policies and set them as appropriate
  std::vector<cmPolicies::PolicyID> ancientPolicies;
  for (PolicyID pid = cmPolicies::CMP0000; pid != cmPolicies::CMPCOUNT;
       pid = PolicyID(pid + 1)) {
    if (isPolicyNewerThan(pid, majorVer, minorVer, patchVer)) {
      if (cmPolicies::GetPolicyStatus(pid) == cmPolicies::REQUIRED_ALWAYS) {
        ancientPolicies.push_back(pid);
      } else {
        cmPolicies::PolicyStatus status = cmPolicies::WARN;
        if (!GetPolicyDefault(mf, idToString(pid), &status) ||
            !mf->SetPolicy(pid, status)) {
          return false;
        }
        if (pid == cmPolicies::CMP0001 &&
            (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
          if (!(mf->GetState()->GetInitializedCacheValue(
                "CMAKE_BACKWARDS_COMPATIBILITY"))) {
            // Set it to 2.4 because that is the last version where the
            // variable had meaning.
            mf->AddCacheDefinition(
              "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
              "For backwards compatibility, what version of CMake "
              "commands and "
              "syntax should this version of CMake try to support.",
              cmStateEnums::STRING);
          }
        }
      }
    } else {
      if (!mf->SetPolicy(pid, cmPolicies::NEW)) {
        return false;
      }
    }
  }

  // Make sure the project does not use any ancient policies.
  if (!ancientPolicies.empty()) {
    DiagnoseAncientPolicies(ancientPolicies, majorVer, minorVer, patchVer, mf);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  return true;
}